

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O2

ktx_error_code_e ktxMem_expand(ktxMem *pMem,ktx_size_t newsize)

{
  ktx_size_t kVar1;
  ktx_uint8_t *pkVar2;
  ktx_error_code_e kVar3;
  ktx_size_t __size;
  bool bVar4;
  
  if (newsize == 0) {
    __assert_fail("pMem != NULL && newsize != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/memstream.c"
                  ,0xbf,"ktx_error_code_e ktxMem_expand(ktxMem *, const ktx_size_t)");
  }
  kVar1 = pMem->alloc_size;
  __size = 0x100;
  if (kVar1 != 0) {
    __size = kVar1;
  }
  while (__size < newsize) {
    bVar4 = (long)__size < 0;
    __size = __size * 2;
    if (bVar4) {
      __size = 0xffffffffffffffff;
    }
  }
  kVar3 = KTX_SUCCESS;
  if (__size != kVar1) {
    if (pMem->bytes == (ktx_uint8_t *)0x0) {
      pkVar2 = (ktx_uint8_t *)malloc(__size);
    }
    else {
      pkVar2 = (ktx_uint8_t *)realloc(pMem->bytes,__size);
    }
    pMem->bytes = pkVar2;
    if (pkVar2 == (ktx_uint8_t *)0x0) {
      pMem->alloc_size = 0;
      pMem->used_size = 0;
      kVar3 = KTX_OUT_OF_MEMORY;
    }
    else {
      pMem->alloc_size = __size;
    }
  }
  return kVar3;
}

Assistant:

static KTX_error_code
ktxMem_expand(ktxMem *pMem, const ktx_size_t newsize)
{
    ktx_size_t new_alloc_size;

    assert(pMem != NULL && newsize != 0);

    new_alloc_size = pMem->alloc_size == 0 ?
                     KTX_MEM_DEFAULT_ALLOCATED_SIZE : pMem->alloc_size;
    while (new_alloc_size < newsize) {
        ktx_size_t alloc_size = new_alloc_size;
        new_alloc_size <<= 1;
        if (new_alloc_size < alloc_size) {
            /* Overflow. Set to maximum size. newsize can't be larger. */
            new_alloc_size = (ktx_size_t)-1L;
        }
    }

    if (new_alloc_size == pMem->alloc_size)
        return KTX_SUCCESS;

    if (!pMem->bytes)
        pMem->bytes = (ktx_uint8_t*)malloc(new_alloc_size);
    else
        pMem->bytes = (ktx_uint8_t*)realloc(pMem->bytes, new_alloc_size);

    if (!pMem->bytes)
    {
        pMem->alloc_size = 0;
        pMem->used_size = 0;
        return KTX_OUT_OF_MEMORY;
    }

    pMem->alloc_size = new_alloc_size;
    return KTX_SUCCESS;
}